

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv_cwd(char *buffer,size_t *size)

{
  char *pcVar1;
  int *piVar2;
  size_t sVar3;
  size_t local_1028;
  char scratch [4097];
  size_t *size_local;
  char *buffer_local;
  
  if ((buffer == (char *)0x0) || (size == (size_t *)0x0)) {
    return -0x16;
  }
  unique0x100000f3 = size;
  pcVar1 = getcwd(buffer,*size);
  size_local = (size_t *)buffer;
  if (pcVar1 == (char *)0x0) {
    piVar2 = __errno_location();
    if (*piVar2 != 0x22) {
      piVar2 = __errno_location();
      return -*piVar2;
    }
    pcVar1 = getcwd((char *)&local_1028,0x1001);
    if (pcVar1 == (char *)0x0) {
      piVar2 = __errno_location();
      return -*piVar2;
    }
    size_local = &local_1028;
  }
  sVar3 = strlen((char *)size_local);
  *stack0xffffffffffffffe0 = sVar3;
  if ((1 < *stack0xffffffffffffffe0) &&
     (*(char *)((long)size_local + (*stack0xffffffffffffffe0 - 1)) == '/')) {
    *stack0xffffffffffffffe0 = *stack0xffffffffffffffe0 - 1;
    *(undefined1 *)((long)size_local + *stack0xffffffffffffffe0) = 0;
  }
  if (size_local == &local_1028) {
    *stack0xffffffffffffffe0 = *stack0xffffffffffffffe0 + 1;
    buffer_local._4_4_ = -0x69;
  }
  else {
    buffer_local._4_4_ = 0;
  }
  return buffer_local._4_4_;
}

Assistant:

int uv_cwd(char* buffer, size_t* size) {
  char scratch[1 + UV__PATH_MAX];

  if (buffer == NULL || size == NULL)
    return UV_EINVAL;

  /* Try to read directly into the user's buffer first... */
  if (getcwd(buffer, *size) != NULL)
    goto fixup;

  if (errno != ERANGE)
    return UV__ERR(errno);

  /* ...or into scratch space if the user's buffer is too small
   * so we can report how much space to provide on the next try.
   */
  if (getcwd(scratch, sizeof(scratch)) == NULL)
    return UV__ERR(errno);

  buffer = scratch;

fixup:

  *size = strlen(buffer);

  if (*size > 1 && buffer[*size - 1] == '/') {
    *size -= 1;
    buffer[*size] = '\0';
  }

  if (buffer == scratch) {
    *size += 1;
    return UV_ENOBUFS;
  }

  return 0;
}